

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::MethodDescriptorProto::MethodDescriptorProto
          (MethodDescriptorProto *this,MethodDescriptorProto *from)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__MethodDescriptorProto_0028ff70;
  UnknownFieldSet::UnknownFieldSet(&this->_unknown_fields_);
  this->name_ = (string *)internal::kEmptyString_abi_cxx11_;
  this->input_type_ = (string *)internal::kEmptyString_abi_cxx11_;
  this->output_type_ = (string *)internal::kEmptyString_abi_cxx11_;
  this->options_ = (MethodOptions *)0x0;
  this->_cached_size_ = 0;
  this->_has_bits_[0] = 0;
  MergeFrom(this,from);
  return;
}

Assistant:

MethodDescriptorProto::MethodDescriptorProto(const MethodDescriptorProto& from)
  : ::google::protobuf::Message() {
  SharedCtor();
  MergeFrom(from);
}